

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O2

void __thiscall
Am_Load_Save_Context::Register_Prototype(Am_Load_Save_Context *this,char *name,Am_Wrapper *value)

{
  Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_> *this_00;
  Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this_01;
  int iVar1;
  Am_Load_Save_Context_Data *this_02;
  undefined4 extraout_var;
  Wrapper_Holder holder;
  Wrapper_Holder local_50;
  Wrapper_Holder local_48;
  Name_Num local_40;
  Name_Num local_30;
  
  this_02 = this->data;
  if (this_02 == (Am_Load_Save_Context_Data *)0x0) {
    this_02 = (Am_Load_Save_Context_Data *)operator_new(0x48);
    Am_Load_Save_Context_Data::Am_Load_Save_Context_Data(this_02);
    this->data = this_02;
  }
  iVar1 = (*(this_02->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                    (this_02);
  this->data = (Am_Load_Save_Context_Data *)CONCAT44(extraout_var,iVar1);
  this_00 = ((Am_Load_Save_Context_Data *)CONCAT44(extraout_var,iVar1))->names;
  if (value != (Am_Wrapper *)0x0) {
    value->refs = value->refs + 1;
  }
  local_30.number = -1;
  holder.data = value;
  local_48.data = value;
  local_30.name = name;
  OpenAmulet::Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_>::SetAt
            (this_00,&local_48,&local_30);
  Wrapper_Holder::~Wrapper_Holder(&local_48);
  this_01 = this->data->prototypes;
  local_40.number = -1;
  local_50.data = holder.data;
  if (holder.data != (Am_Wrapper *)0x0) {
    (holder.data)->refs = (holder.data)->refs + 1;
  }
  local_40.name = name;
  OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::SetAt
            (this_01,&local_40,&local_50);
  Wrapper_Holder::~Wrapper_Holder(&local_50);
  Wrapper_Holder::~Wrapper_Holder(&holder);
  return;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}